

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

NondegeneracyCheckResult * __thiscall
slang::ast::BinaryAssertionExpr::checkNondegeneracyImpl
          (NondegeneracyCheckResult *__return_storage_ptr__,BinaryAssertionExpr *this)

{
  SourceRange *pSVar1;
  SourceLocation SVar2;
  AssertionExpr *this_00;
  optional<slang::ast::SequenceRange> oVar3;
  _Optional_base<slang::ast::SequenceRange,_true,_true> _Var4;
  SourceRange SVar5;
  NondegeneracyCheckResult rightNondegen;
  NondegeneracyCheckResult leftNondegen;
  uint local_90;
  NondegeneracyCheckResult local_80;
  NondegeneracyCheckResult local_60;
  Token local_40;
  
  AssertionExpr::checkNondegeneracy(&local_60,this->left);
  this_00 = this->right;
  AssertionExpr::checkNondegeneracy(&local_80,this_00);
  (__return_storage_ptr__->status).m_bits = 0;
  (__return_storage_ptr__->noMatchRange).startLoc = (SourceLocation)0x0;
  (__return_storage_ptr__->noMatchRange).endLoc = (SourceLocation)0x0;
  __return_storage_ptr__->isAlwaysFalse = false;
  if (Within < this->op) {
    return __return_storage_ptr__;
  }
  pSVar1 = &__return_storage_ptr__->noMatchRange;
  switch(this->op) {
  case And:
    if ((local_80.status.m_bits & local_60.status.m_bits & 1) != 0) {
      (__return_storage_ptr__->status).m_bits = 1;
    }
    if (((local_60.status.m_bits | local_80.status.m_bits) & 4) == 0) {
      return __return_storage_ptr__;
    }
    *(byte *)&(__return_storage_ptr__->status).m_bits =
         (byte)(__return_storage_ptr__->status).m_bits | 4;
    if ((local_60.status.m_bits & 4) != 0) goto LAB_0036dda3;
    if ((local_80.status.m_bits & 4) != 0) goto LAB_0036dd74;
    goto LAB_0036de0e;
  case Or:
    if (((local_80.status.m_bits | local_60.status.m_bits) & 1) != 0) {
      (__return_storage_ptr__->status).m_bits = 1;
    }
    if ((byte)((byte)local_60.status.m_bits >> 2 & (byte)((local_80.status.m_bits & 4) >> 2)) != 1)
    {
      return __return_storage_ptr__;
    }
    *(byte *)&(__return_storage_ptr__->status).m_bits =
         (byte)(__return_storage_ptr__->status).m_bits | 4;
LAB_0036dda3:
    pSVar1->startLoc = local_60.noMatchRange.startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = local_60.noMatchRange.endLoc;
    goto LAB_0036ddc3;
  case Intersect:
    if ((local_80.status.m_bits & local_60.status.m_bits & 1) != 0) {
      (__return_storage_ptr__->status).m_bits = 1;
    }
    oVar3 = AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>
                      (this->left,(SequenceLengthVisitor *)this_00);
    local_90 = oVar3.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_;
    _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> =
         (_Optional_payload<slang::ast::SequenceRange,_true,_true,_true>)
         AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>
                   (this->right,(SequenceLengthVisitor *)this_00);
    if (((local_60.status.m_bits | local_80.status.m_bits) & 4) == 0) {
      if ((oVar3.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ >> 0x20 & 1) == 0) {
        return __return_storage_ptr__;
      }
      if (((undefined1  [16])
           _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> &
          (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        return __return_storage_ptr__;
      }
      if ((((undefined1  [16])
            oVar3.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRange> & (undefined1  [16])0x1) ==
           (undefined1  [16])0x0) ||
         (_Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_
          <= oVar3.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._4_4_))
      goto LAB_0036dcf1;
    }
    break;
  case Throughout:
    if ((local_80.status.m_bits & 1) != 0) {
      (__return_storage_ptr__->status).m_bits = 1;
    }
    if ((local_80.status.m_bits & 4) == 0) {
      return __return_storage_ptr__;
    }
    *(byte *)&(__return_storage_ptr__->status).m_bits =
         (byte)(__return_storage_ptr__->status).m_bits | 4;
LAB_0036dd74:
    pSVar1->startLoc = local_80.noMatchRange.startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = local_80.noMatchRange.endLoc;
    local_60.isAlwaysFalse = local_80.isAlwaysFalse;
    goto LAB_0036ddc3;
  case Within:
    if ((local_80.status.m_bits & local_60.status.m_bits & 1) != 0) {
      (__return_storage_ptr__->status).m_bits = 1;
    }
    oVar3 = AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>
                      (this->left,(SequenceLengthVisitor *)this_00);
    local_90 = oVar3.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_;
    _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> =
         (_Optional_payload<slang::ast::SequenceRange,_true,_true,_true>)
         AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>
                   (this->right,(SequenceLengthVisitor *)this_00);
    if (((local_60.status.m_bits | local_80.status.m_bits) & 4) == 0) {
      if ((oVar3.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ >> 0x20 & 1) == 0) {
        return __return_storage_ptr__;
      }
      if (((undefined1  [16])
           _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> &
          (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        return __return_storage_ptr__;
      }
LAB_0036dcf1:
      if (((undefined1  [16])
           _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> &
          (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return __return_storage_ptr__;
      }
      if (local_90 <=
          _Var4._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._4_4_)
      {
        return __return_storage_ptr__;
      }
    }
  }
  *(byte *)&(__return_storage_ptr__->status).m_bits =
       (byte)(__return_storage_ptr__->status).m_bits | 4;
  if ((local_60.status.m_bits & 4) == 0) {
    if ((local_80.status.m_bits & 4) == 0) {
LAB_0036de0e:
      if (this->left->syntax == (SyntaxNode *)0x0) {
        return __return_storage_ptr__;
      }
      if (this->right->syntax == (SyntaxNode *)0x0) {
        return __return_storage_ptr__;
      }
      local_40 = slang::syntax::SyntaxNode::getFirstToken(this->left->syntax);
      SVar2 = parsing::Token::location(&local_40);
      SVar5 = slang::syntax::SyntaxNode::sourceRange(this->right->syntax);
      (__return_storage_ptr__->noMatchRange).startLoc = SVar2;
      (__return_storage_ptr__->noMatchRange).endLoc = SVar5.endLoc;
      local_60.isAlwaysFalse = false;
    }
    else {
      pSVar1->startLoc = local_80.noMatchRange.startLoc;
      (__return_storage_ptr__->noMatchRange).endLoc = local_80.noMatchRange.endLoc;
      local_60.isAlwaysFalse = local_80.isAlwaysFalse;
    }
  }
  else {
    pSVar1->startLoc = local_60.noMatchRange.startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = local_60.noMatchRange.endLoc;
  }
LAB_0036ddc3:
  __return_storage_ptr__->isAlwaysFalse = local_60.isAlwaysFalse;
  return __return_storage_ptr__;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult BinaryAssertionExpr::checkNondegeneracyImpl() const {
    const auto leftNondegen = left.checkNondegeneracy();
    const auto rightNondegen = right.checkNondegeneracy();
    const auto leftNondegenSt = leftNondegen.status;
    const auto rightNondegenSt = rightNondegen.status;
    const bool leftAdmitsEmpty = leftNondegenSt.has(NondegeneracyStatus::AdmitsEmpty);
    const bool rightAdmitsEmpty = rightNondegenSt.has(NondegeneracyStatus::AdmitsEmpty);
    const bool leftAdmitsNoMatch = leftNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch);
    const bool rightAdmitsNoMatch = rightNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch);

    NondegeneracyCheckResult res;
    auto joinNoMatchReasons = [&] {
        if (leftAdmitsNoMatch) {
            res.noMatchRange = leftNondegen.noMatchRange;
            res.isAlwaysFalse = leftNondegen.isAlwaysFalse;
        }
        else if (rightAdmitsNoMatch) {
            res.noMatchRange = rightNondegen.noMatchRange;
            res.isAlwaysFalse = rightNondegen.isAlwaysFalse;
        }
        else if (left.syntax && right.syntax) {
            res.noMatchRange = {left.syntax->getFirstToken().location(),
                                right.syntax->sourceRange().end()};
            res.isAlwaysFalse = false;
        }
    };

    switch (op) {
        case BinaryAssertionOperator::Or: {
            if (leftAdmitsEmpty || rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `or` full sequence is no match if and only if both parts are no match.
            if (leftAdmitsNoMatch && rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::And: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `and` full sequence is no match if and only if any part is no match.
            if (leftAdmitsNoMatch || rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Intersect: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `intersect` full sequence is no match if both parts don't have any
            // possible overlap in their length ranges.
            const auto leftLen = left.computeSequenceLength();
            const auto rightLen = right.computeSequenceLength();
            if (leftAdmitsNoMatch || rightAdmitsNoMatch ||
                (leftLen && rightLen && !leftLen->canIntersect(*rightLen))) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Within: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `within` full sequence is no match if left side delay range is within
            // right side delay range.
            const auto leftLen = left.computeSequenceLength();
            const auto rightLen = right.computeSequenceLength();
            if (leftAdmitsNoMatch || rightAdmitsNoMatch ||
                (leftLen && rightLen && !leftLen->canBeWithin(*rightLen))) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Throughout: {
            if (rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `throughout` full sequence is no match if right part is no match
            if (rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                res.noMatchRange = rightNondegen.noMatchRange;
                res.isAlwaysFalse = rightNondegen.isAlwaysFalse;
            }
            break;
        }
        default:
            break;
    }

    return res;
}